

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O2

void SipHashRound(uint64_t *v0,uint64_t *v1,uint64_t *v2,uint64_t *v3)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *v0 = *v0 + *v1;
  uVar2 = *v1 << 0xd | *v1 >> 0x33;
  *v1 = uVar2;
  *v1 = uVar2 ^ *v0;
  *v0 = *v0 << 0x20 | *v0 >> 0x20;
  *v2 = *v2 + *v3;
  uVar2 = *v3 << 0x10 | *v3 >> 0x30;
  *v3 = uVar2;
  uVar2 = uVar2 ^ *v2;
  *v3 = uVar2;
  *v0 = *v0 + uVar2;
  uVar2 = *v3 << 0x15 | *v3 >> 0x2b;
  *v3 = uVar2;
  *v3 = uVar2 ^ *v0;
  *v2 = *v2 + *v1;
  uVar2 = *v1 << 0x11 | *v1 >> 0x2f;
  *v1 = uVar2;
  *v1 = uVar2 ^ *v2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    *v2 = *v2 << 0x20 | *v2 >> 0x20;
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void SipHashRound(uint64_t& v0, uint64_t& v1, uint64_t& v2, uint64_t& v3) {
    v0 += v1; v1 = Rot<13>(v1); v1 ^= v0;
    v0 = Rot<32>(v0);
    v2 += v3; v3 = Rot<16>(v3); v3 ^= v2;
    v0 += v3; v3 = Rot<21>(v3); v3 ^= v0;
    v2 += v1; v1 = Rot<17>(v1); v1 ^= v2;
    v2 = Rot<32>(v2);
}